

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_sse3.c
# Opt level: O1

void av1_nn_predict_sse3(float *input_nodes,NN_CONFIG *nn_config,int reduce_prec,float *output)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  uint uVar4;
  float *pfVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int *piVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  float *pfVar21;
  float *pfVar22;
  int in_node;
  float *pfVar23;
  ulong uVar24;
  float *pfVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  float *pfVar31;
  __m128 zero;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float buf [2] [128];
  float local_478 [274];
  __m128 hadd [2];
  
  uVar17 = (ulong)(uint)nn_config->num_hidden_layers;
  if (-1 < nn_config->num_hidden_layers) {
    uVar18 = 0;
    uVar20 = 0;
    uVar3 = nn_config->num_inputs;
    do {
      uVar28 = (ulong)uVar3;
      uVar17 = uVar17 & 0xffffffff;
      pfVar22 = local_478 + (ulong)uVar18 * 0x80 + 0x10;
      if (uVar20 == uVar17) {
        pfVar22 = output;
      }
      pfVar25 = nn_config->weights[uVar20];
      piVar15 = nn_config->num_hidden_nodes + uVar20;
      if (uVar20 == uVar17) {
        piVar15 = &nn_config->num_outputs;
      }
      uVar4 = *piVar15;
      pfVar5 = nn_config->bias[uVar20];
      uVar26 = (ulong)uVar4;
      if ((uVar4 & 7) == 0 && (uVar3 & 3) == 0) {
        if (0 < (int)uVar4) {
          lVar16 = (long)(int)uVar3;
          pfVar21 = pfVar25 + lVar16;
          uVar19 = 0;
          do {
            auVar32 = *(undefined1 (*) [16])(pfVar5 + uVar19);
            auVar39 = *(undefined1 (*) [16])(pfVar5 + uVar19 + 4);
            if (0 < (int)uVar3) {
              lVar30 = 0;
              pfVar23 = pfVar21;
              pfVar31 = pfVar25;
              auVar36 = auVar32;
              auVar37 = auVar39;
              do {
                pfVar1 = input_nodes + lVar30;
                fVar38 = *pfVar1;
                fVar40 = pfVar1[1];
                fVar41 = pfVar1[2];
                fVar42 = pfVar1[3];
                lVar29 = 0;
                lVar27 = 0;
                do {
                  pfVar1 = (float *)((long)pfVar31 + lVar29);
                  fVar43 = pfVar1[2];
                  fVar44 = pfVar1[3];
                  pfVar2 = (float *)((long)pfVar23 + lVar29);
                  fVar7 = *pfVar2;
                  fVar8 = pfVar2[1];
                  fVar9 = pfVar2[2];
                  fVar10 = pfVar2[3];
                  *(float *)((long)local_478 + lVar27) = *pfVar1 * fVar38 + pfVar1[1] * fVar40;
                  *(float *)((long)local_478 + lVar27 + 4) = fVar43 * fVar41 + fVar44 * fVar42;
                  *(float *)((long)local_478 + lVar27 + 8) = fVar7 * fVar38 + fVar8 * fVar40;
                  *(float *)((long)local_478 + lVar27 + 0xc) = fVar9 * fVar41 + fVar10 * fVar42;
                  lVar27 = lVar27 + 0x10;
                  lVar29 = lVar29 + lVar16 * 8;
                } while (lVar27 != 0x40);
                auVar32._0_4_ = auVar36._0_4_ + local_478[0] + local_478[1];
                auVar32._4_4_ = auVar36._4_4_ + local_478[2] + local_478[3];
                auVar32._8_4_ = auVar36._8_4_ + local_478[4] + local_478[5];
                auVar32._12_4_ = auVar36._12_4_ + local_478[6] + local_478[7];
                auVar39._0_4_ = auVar37._0_4_ + local_478[8] + local_478[9];
                auVar39._4_4_ = auVar37._4_4_ + local_478[10] + local_478[0xb];
                auVar39._8_4_ = auVar37._8_4_ + local_478[0xc] + local_478[0xd];
                auVar39._12_4_ = auVar37._12_4_ + local_478[0xe] + local_478[0xf];
                lVar30 = lVar30 + 4;
                pfVar23 = pfVar23 + 4;
                pfVar31 = pfVar31 + 4;
                auVar36 = auVar32;
                auVar37 = auVar39;
              } while (lVar30 < lVar16);
            }
            if (uVar20 != uVar17) {
              auVar39 = maxps(auVar39,ZEXT816(0));
              auVar32 = maxps(auVar32,ZEXT816(0));
            }
            *(undefined1 (*) [16])(pfVar22 + (uVar19 | 4)) = auVar39;
            *(undefined1 (*) [16])(pfVar22 + uVar19) = auVar32;
            uVar19 = uVar19 + 8;
            pfVar21 = pfVar21 + uVar28 * 8;
            pfVar25 = pfVar25 + uVar28 * 8;
          } while (uVar19 < uVar26);
        }
      }
      else if ((uVar4 & 3) == 0 && (uVar3 & 7) == 0) {
        if (0 < (int)uVar4) {
          pfVar25 = pfVar25 + 4;
          uVar19 = 0;
          do {
            auVar33 = *(undefined1 (*) [16])(pfVar5 + uVar19);
            if (0 < (int)uVar3) {
              lVar16 = 0;
              pfVar21 = pfVar25;
              auVar36 = auVar33;
              do {
                pfVar23 = input_nodes + lVar16;
                fVar38 = *pfVar23;
                fVar40 = pfVar23[1];
                fVar41 = pfVar23[2];
                fVar42 = pfVar23[3];
                pfVar23 = input_nodes + lVar16 + 4;
                fVar43 = *pfVar23;
                fVar44 = pfVar23[1];
                fVar7 = pfVar23[2];
                fVar8 = pfVar23[3];
                lVar30 = 0;
                pfVar23 = pfVar21;
                do {
                  fVar9 = pfVar23[-3];
                  fVar10 = pfVar23[-2];
                  fVar11 = pfVar23[-1];
                  fVar12 = pfVar23[1];
                  fVar13 = pfVar23[2];
                  fVar14 = pfVar23[3];
                  *(float *)((long)local_478 + lVar30) = *pfVar23 * fVar43 + pfVar23[-4] * fVar38;
                  *(float *)((long)local_478 + lVar30 + 4) = fVar12 * fVar44 + fVar9 * fVar40;
                  *(float *)((long)local_478 + lVar30 + 8) = fVar13 * fVar7 + fVar10 * fVar41;
                  *(float *)((long)local_478 + lVar30 + 0xc) = fVar14 * fVar8 + fVar11 * fVar42;
                  lVar30 = lVar30 + 0x10;
                  pfVar23 = pfVar23 + (int)uVar3;
                } while (lVar30 != 0x40);
                auVar33._0_4_ =
                     auVar36._0_4_ + local_478[0] + local_478[1] + local_478[2] + local_478[3];
                auVar33._4_4_ =
                     auVar36._4_4_ + local_478[4] + local_478[5] + local_478[6] + local_478[7];
                auVar33._8_4_ =
                     auVar36._8_4_ + local_478[8] + local_478[9] + local_478[10] + local_478[0xb];
                auVar33._12_4_ =
                     auVar36._12_4_ +
                     local_478[0xc] + local_478[0xd] + local_478[0xe] + local_478[0xf];
                lVar16 = lVar16 + 8;
                pfVar21 = pfVar21 + 8;
                auVar36 = auVar33;
              } while (lVar16 < (int)uVar3);
            }
            if (uVar20 != uVar17) {
              auVar33 = maxps(auVar33,ZEXT816(0));
            }
            *(undefined1 (*) [16])(pfVar22 + uVar19) = auVar33;
            uVar19 = uVar19 + 4;
            pfVar25 = pfVar25 + uVar28 * 4;
          } while (uVar19 < uVar26);
        }
      }
      else if (((uVar3 | uVar4) & 3) == 0) {
        if (0 < (int)uVar4) {
          lVar16 = (long)(int)uVar3;
          pfVar21 = pfVar25 + lVar16;
          uVar19 = 0;
          do {
            auVar34 = *(undefined1 (*) [16])(pfVar5 + uVar19);
            if (0 < (int)uVar3) {
              lVar30 = 0;
              pfVar23 = pfVar25;
              pfVar31 = pfVar21;
              auVar36 = auVar34;
              do {
                pfVar1 = input_nodes + lVar30;
                fVar38 = *pfVar1;
                fVar40 = pfVar1[1];
                fVar41 = pfVar1[2];
                fVar42 = pfVar1[3];
                lVar29 = 0;
                lVar27 = 0;
                do {
                  pfVar1 = (float *)((long)pfVar23 + lVar29);
                  fVar43 = pfVar1[2];
                  fVar44 = pfVar1[3];
                  pfVar2 = (float *)((long)pfVar31 + lVar29);
                  fVar7 = *pfVar2;
                  fVar8 = pfVar2[1];
                  fVar9 = pfVar2[2];
                  fVar10 = pfVar2[3];
                  *(float *)((long)local_478 + lVar27) = *pfVar1 * fVar38 + pfVar1[1] * fVar40;
                  *(float *)((long)local_478 + lVar27 + 4) = fVar43 * fVar41 + fVar44 * fVar42;
                  *(float *)((long)local_478 + lVar27 + 8) = fVar7 * fVar38 + fVar8 * fVar40;
                  *(float *)((long)local_478 + lVar27 + 0xc) = fVar9 * fVar41 + fVar10 * fVar42;
                  lVar27 = lVar27 + 0x10;
                  lVar29 = lVar29 + lVar16 * 8;
                } while (lVar27 == 0x10);
                auVar34._0_4_ = auVar36._0_4_ + local_478[0] + local_478[1];
                auVar34._4_4_ = auVar36._4_4_ + local_478[2] + local_478[3];
                auVar34._8_4_ = auVar36._8_4_ + local_478[4] + local_478[5];
                auVar34._12_4_ = auVar36._12_4_ + local_478[6] + local_478[7];
                lVar30 = lVar30 + 4;
                pfVar31 = pfVar31 + 4;
                pfVar23 = pfVar23 + 4;
                auVar36 = auVar34;
              } while (lVar30 < lVar16);
            }
            if (uVar20 != uVar17) {
              auVar34 = maxps(auVar34,ZEXT816(0));
            }
            *(undefined1 (*) [16])(pfVar22 + uVar19) = auVar34;
            uVar19 = uVar19 + 4;
            pfVar21 = pfVar21 + uVar28 * 4;
            pfVar25 = pfVar25 + uVar28 * 4;
          } while (uVar19 < uVar26);
        }
      }
      else if ((uVar3 & 7) == 0) {
        if (0 < (int)uVar4) {
          pfVar25 = pfVar25 + 4;
          uVar19 = 0;
          do {
            fVar38 = pfVar5[uVar19];
            auVar36._4_4_ = fVar38;
            auVar36._0_4_ = fVar38;
            auVar36._8_4_ = fVar38;
            auVar36._12_4_ = fVar38;
            if (0 < (int)uVar3) {
              lVar16 = 0;
              auVar37 = auVar36;
              do {
                pfVar21 = input_nodes + lVar16;
                pfVar31 = input_nodes + lVar16 + 4;
                pfVar1 = pfVar25 + lVar16 + -4;
                pfVar23 = pfVar25 + lVar16;
                fVar38 = *pfVar23 * *pfVar31 + *pfVar1 * *pfVar21;
                fVar41 = pfVar23[1] * pfVar31[1] + pfVar1[1] * pfVar21[1];
                fVar43 = pfVar23[2] * pfVar31[2] + pfVar1[2] * pfVar21[2];
                fVar44 = pfVar23[3] * pfVar31[3] + pfVar1[3] * pfVar21[3];
                fVar40 = fVar38 + fVar41;
                fVar42 = fVar43 + fVar44;
                fVar38 = fVar38 + fVar41;
                fVar43 = fVar43 + fVar44;
                auVar36._0_4_ = auVar37._0_4_ + fVar40 + fVar42;
                auVar36._4_4_ = auVar37._4_4_ + fVar38 + fVar43;
                auVar36._8_4_ = auVar37._8_4_ + fVar40 + fVar42;
                auVar36._12_4_ = auVar37._12_4_ + fVar38 + fVar43;
                lVar16 = lVar16 + 8;
                auVar37 = auVar36;
              } while (lVar16 < (int)uVar3);
            }
            if (uVar20 != uVar17) {
              auVar36 = maxps(auVar36,ZEXT816(0));
            }
            pfVar22[uVar19] = auVar36._0_4_;
            uVar19 = uVar19 + 1;
            pfVar25 = pfVar25 + uVar28;
          } while (uVar19 != uVar26);
        }
      }
      else if ((uVar3 & 3) == 0) {
        if (0 < (int)uVar4) {
          uVar19 = 0;
          do {
            fVar38 = pfVar5[uVar19];
            auVar37._4_4_ = fVar38;
            auVar37._0_4_ = fVar38;
            auVar37._8_4_ = fVar38;
            auVar37._12_4_ = fVar38;
            if (0 < (int)uVar3) {
              lVar16 = 0;
              auVar36 = auVar37;
              do {
                auVar37 = *(undefined1 (*) [16])(input_nodes + lVar16);
                pfVar21 = pfVar25 + lVar16;
                fVar38 = *pfVar21 * auVar37._0_4_;
                fVar41 = pfVar21[1] * auVar37._4_4_;
                fVar43 = pfVar21[2] * auVar37._8_4_;
                fVar44 = pfVar21[3] * auVar37._12_4_;
                fVar40 = fVar38 + fVar41;
                fVar42 = fVar43 + fVar44;
                fVar38 = fVar38 + fVar41;
                fVar43 = fVar43 + fVar44;
                auVar37._0_4_ = auVar36._0_4_ + fVar40 + fVar42;
                auVar37._4_4_ = auVar36._4_4_ + fVar38 + fVar43;
                auVar37._8_4_ = auVar36._8_4_ + fVar40 + fVar42;
                auVar37._12_4_ = auVar36._12_4_ + fVar38 + fVar43;
                lVar16 = lVar16 + 4;
                auVar36 = auVar37;
              } while (lVar16 < (int)uVar3);
            }
            if (uVar20 != uVar17) {
              auVar37 = maxps(auVar37,ZEXT816(0));
            }
            pfVar22[uVar19] = auVar37._0_4_;
            uVar19 = uVar19 + 1;
            pfVar25 = pfVar25 + uVar28;
          } while (uVar19 != uVar26);
        }
      }
      else if (0 < (int)uVar4) {
        uVar19 = 0;
        do {
          fVar38 = pfVar5[uVar19];
          auVar35._4_4_ = fVar38;
          auVar35._0_4_ = fVar38;
          auVar35._8_4_ = fVar38;
          auVar35._12_4_ = fVar38;
          if (0 < (int)uVar3) {
            uVar24 = 0;
            auVar36 = auVar35;
            do {
              fVar38 = input_nodes[uVar24] * pfVar25[uVar24];
              auVar35._0_4_ = auVar36._0_4_ + fVar38;
              auVar35._4_4_ = auVar36._4_4_ + fVar38;
              auVar35._8_4_ = auVar36._8_4_ + fVar38;
              auVar35._12_4_ = auVar36._12_4_ + fVar38;
              uVar24 = uVar24 + 1;
              auVar36 = auVar35;
            } while (uVar28 != uVar24);
          }
          if (uVar20 != uVar17) {
            auVar35 = maxps(auVar35,ZEXT816(0));
          }
          pfVar22[uVar19] = auVar35._0_4_;
          uVar19 = uVar19 + 1;
          pfVar25 = pfVar25 + uVar28;
        } while (uVar19 != uVar26);
      }
      uVar18 = 1 - uVar18;
      uVar17 = (ulong)nn_config->num_hidden_layers;
      bVar6 = (long)uVar20 < (long)uVar17;
      uVar20 = uVar20 + 1;
      input_nodes = pfVar22;
      uVar3 = uVar4;
    } while (bVar6);
  }
  if (reduce_prec == 0) {
    return;
  }
  av1_nn_output_prec_reduce(output,nn_config->num_outputs);
  return;
}

Assistant:

void av1_nn_predict_sse3(const float *input_nodes,
                         const NN_CONFIG *const nn_config, int reduce_prec,
                         float *const output) {
  float buf[2][NN_MAX_NODES_PER_LAYER];
  int buf_index = 0;
  int num_inputs = nn_config->num_inputs;

  // Hidden layers, except the final iteration is the output layer.
  for (int layer = 0; layer <= nn_config->num_hidden_layers; layer++) {
    const float *layer_weights = nn_config->weights[layer];
    const float *layer_bias = nn_config->bias[layer];
    bool output_layer = (layer == nn_config->num_hidden_layers);
    float *const output_nodes = output_layer ? output : &buf[buf_index][0];
    const int num_outputs = output_layer ? nn_config->num_outputs
                                         : nn_config->num_hidden_nodes[layer];

    if (num_inputs % 4 == 0 && num_outputs % 8 == 0) {
      for (int out = 0; out < num_outputs; out += 8) {
        __m128 out_h = _mm_loadu_ps(&layer_bias[out + 4]);
        __m128 out_l = _mm_loadu_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 4) {
          av1_nn_propagate_4to8_sse3(&input_nodes[in],
                                     &layer_weights[out * num_inputs + in],
                                     &out_h, &out_l, num_inputs);
        }
        if (!output_layer) nn_activate8(&out_h, &out_l);
        _mm_storeu_ps(&output_nodes[out + 4], out_h);
        _mm_storeu_ps(&output_nodes[out], out_l);
      }
    } else if (num_inputs % 8 == 0 && num_outputs % 4 == 0) {
      for (int out = 0; out < num_outputs; out += 4) {
        __m128 outputs = _mm_loadu_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 8) {
          nn_propagate_8to4(&input_nodes[in],
                            &layer_weights[out * num_inputs + in], &outputs,
                            num_inputs);
        }
        if (!output_layer) nn_activate4(&outputs);
        _mm_storeu_ps(&output_nodes[out], outputs);
      }
    } else if (num_inputs % 4 == 0 && num_outputs % 4 == 0) {
      for (int out = 0; out < num_outputs; out += 4) {
        __m128 outputs = _mm_loadu_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 4) {
          av1_nn_propagate_4to4_sse3(&input_nodes[in],
                                     &layer_weights[out * num_inputs + in],
                                     &outputs, num_inputs);
        }
        if (!output_layer) nn_activate4(&outputs);
        _mm_storeu_ps(&output_nodes[out], outputs);
      }
    } else if (num_inputs % 8 == 0) {
      for (int out = 0; out < num_outputs; out++) {
        __m128 total = _mm_load1_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 8) {
          nn_propagate_8to1(&input_nodes[in],
                            &layer_weights[out * num_inputs + in], &total);
        }
        if (!output_layer) nn_activate4(&total);
        output_nodes[out] = _mm_cvtss_f32(total);
      }
    } else if (num_inputs % 4 == 0) {
      for (int out = 0; out < num_outputs; out++) {
        __m128 total = _mm_load1_ps(&layer_bias[out]);
        for (int in = 0; in < num_inputs; in += 4) {
          av1_nn_propagate_4to1_sse3(
              &input_nodes[in], &layer_weights[out * num_inputs + in], &total);
        }
        if (!output_layer) nn_activate4(&total);
        output_nodes[out] = _mm_cvtss_f32(total);
      }
    } else {
      // Use SSE instructions for scalar operations to avoid the latency of
      // swapping between SIMD and FPU modes.
      for (int out = 0; out < num_outputs; out++) {
        __m128 total = _mm_load1_ps(&layer_bias[out]);
        for (int in_node = 0; in_node < num_inputs; in_node++) {
          __m128 input = _mm_load1_ps(&input_nodes[in_node]);
          __m128 weight =
              _mm_load1_ps(&layer_weights[num_inputs * out + in_node]);
          total = _mm_add_ps(total, _mm_mul_ps(input, weight));
        }
        if (!output_layer) nn_activate4(&total);
        output_nodes[out] = _mm_cvtss_f32(total);
      }
    }
    input_nodes = output_nodes;
    num_inputs = num_outputs;
    buf_index = 1 - buf_index;
  }
  if (reduce_prec) av1_nn_output_prec_reduce(output, nn_config->num_outputs);
}